

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

bool __thiscall
Qentem::Value<wchar_t>::GroupBy
          (Value<wchar_t> *this,Value<wchar_t> *groupedValue,wchar_t *key,SizeT length)

{
  bool bVar1;
  Value<wchar_t> *this_00;
  Value<wchar_t> *pVVar2;
  byte bVar3;
  SizeT SVar4;
  Value<wchar_t> *this_01;
  long lVar5;
  uint local_6c;
  wchar_t *local_68;
  SizeT local_5c;
  StringStream<wchar_t> local_58;
  HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
  local_48;
  Value<wchar_t> *local_38;
  
  for (; this->type_ == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  if (this->type_ == Array) {
    local_58.storage_ = (wchar_t *)0x0;
    local_58.length_ = 0;
    local_58.capacity_ = 0;
    local_48.hashTable_ = (SizeT *)0x0;
    local_48.index_ = 0;
    local_48.capacity_ = 0;
    this_01 = (this->field_0).array_.storage_;
    local_68 = (wchar_t *)0x0;
    local_6c = 0;
    reset(groupedValue);
    SVar4 = 1;
    groupedValue->type_ = Object;
    if ((this_01 != (Value<wchar_t> *)0x0) && (this_01->type_ == Object)) {
      bVar1 = HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
              ::GetKeyIndex((HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                             *)this_01,&local_5c,key,length);
      if (bVar1) {
        local_38 = (this->field_0).array_.storage_ + (this->field_0).array_.index_;
        while( true ) {
          length = (SizeT)(this_01 == local_38);
          if (this_01 == local_38) break;
          SVar4 = 0;
          if (this_01->type_ != Object) goto LAB_00112e3e;
          pVVar2 = (Value<wchar_t> *)
                   ((this_01->field_0).object_.
                    super_HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
                    .hashTable_ + (ulong)(this_01->field_0).array_.capacity_ + 6);
          for (lVar5 = (ulong)(this_01->field_0).array_.index_ * 0x30; lVar5 != 0;
              lVar5 = lVar5 + -0x30) {
            if ((pVVar2 + -1 == (Value<wchar_t> *)0x0) || (pVVar2->type_ == Undefined)) {
              length = 0;
              goto LAB_00112e70;
            }
            if (SVar4 == local_5c) {
              bVar1 = SetCharAndLength<unsigned_int>(pVVar2,&local_68,&local_6c);
              if (!bVar1) {
                local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
                length = 0;
                bVar1 = CopyValueTo<Qentem::StringStream<wchar_t>,void(Qentem::StringStream<wchar_t>,wchar_t_const*,unsigned_int)>
                                  (pVVar2,&local_58,(RealFormatInfo)0xf,
                                   (_func_void_StringStream<wchar_t>_wchar_t_ptr_uint *)0x0);
                if (!bVar1) goto LAB_00112e70;
                local_68 = local_58.storage_;
                local_6c = local_58.length_;
              }
            }
            else {
              this_00 = HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::operator[]
                                  ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)
                                   &local_48,(String<wchar_t> *)(pVVar2 + -1));
              operator=(this_00,pVVar2);
            }
            SVar4 = SVar4 + 1;
            pVVar2 = pVVar2 + 2;
          }
          pVVar2 = HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>::Get
                             ((HArray<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)
                              groupedValue,local_68,local_6c);
          operator+=(pVVar2,(ObjectT *)&local_48);
          this_01 = this_01 + 1;
        }
LAB_00112e70:
        SVar4 = 0;
      }
    }
LAB_00112e3e:
    bVar3 = (byte)length;
    HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
    ::~HashTable(&local_48);
    Memory::Deallocate(local_58.storage_);
    if ((char)SVar4 == '\0') goto LAB_00112e59;
  }
  bVar3 = 0;
LAB_00112e59:
  return (bool)(bVar3 & 1);
}

Assistant:

bool GroupBy(Value &groupedValue, const Char_T *key, const SizeT length) const {
        const ValueType type = Type();

        if (type == ValueType::Array) {
            StringStream<Char_T> stream;
            ObjectT              new_sub_obj;
            const Value         *item_   = array_.First();
            const Char_T        *str     = nullptr;
            SizeT                str_len = 0;
            SizeT                grouped_key_index;

            groupedValue.reset();
            groupedValue.setTypeToObject();

            if ((item_ != nullptr) && item_->isObject() && item_->object_.GetKeyIndex(grouped_key_index, key, length)) {
                const Value *end = array_.End();

                while (item_ != end) {
                    if ((item_ != nullptr) && item_->isObject()) {
                        SizeT count = 0;

                        const VItem *obj_item = item_->object_.First();
                        const VItem *obj_end  = item_->object_.End();

                        while (obj_item != obj_end) {
                            if ((obj_item != nullptr) && !(obj_item->Value.isUndefined())) {
                                if (count != grouped_key_index) {
                                    new_sub_obj[obj_item->Key] = obj_item->Value;
                                } else if (!(obj_item->Value.SetCharAndLength(str, str_len))) {
                                    stream.Clear();

                                    if (obj_item->Value.CopyValueTo(stream)) {
                                        str     = stream.First();
                                        str_len = stream.Length();
                                    } else {
                                        return false;
                                    }
                                }

                                ++count;
                                ++obj_item;
                                continue;
                            }

                            return false;
                        }

                        groupedValue.object_.Get(str, str_len) += Memory::Move(new_sub_obj);

                        ++item_;
                        continue;
                    }

                    return false;
                }

                return true;
            }
        } else if (type == ValueType::ValuePtr) {
            return value_->GroupBy(groupedValue, key, length);
        }

        return false;
    }